

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_forgetful_chain_inc.h
# Opt level: O2

void InitH42(MemoryManager *m,H42 *self,uint8_t *data,BrotliEncoderParams *params,size_t position,
            size_t bytes,int is_last)

{
  size_t sVar1;
  ulong uVar2;
  
  m[0xd581].alloc_func =
       (brotli_alloc_func)
       (ulong)((*(int *)(data + 4) < 7) + 7 << ((char)*(int *)(data + 4) - 4U & 0x1f));
  if (((position < 0x201) && (params == (BrotliEncoderParams *)0x0)) && ((int)bytes != 0)) {
    for (sVar1 = 0; position != sVar1; sVar1 = sVar1 + 1) {
      uVar2 = (ulong)((uint)(*(int *)((long)self->addr + sVar1) * 0x1e35a7bd) >> 0x11);
      *(undefined4 *)((long)&m->alloc_func + uVar2 * 4) = 0xcccccccc;
      *(undefined2 *)((long)&m[0x1555].free_func + uVar2 * 2) = 0xcccc;
    }
    memset(m + 0x2000,0,0x10000);
    memset(&m[0xd555].free_func,0,0x400);
    if (position != 0) {
      *(undefined4 *)&m[0xd580].alloc_func = 0;
    }
  }
  else if (*(int *)&m[0xd580].alloc_func != 0) {
    memset(m,0xcc,0x20000);
    memset(&m[0x1555].free_func,0,0x20000);
    memset(&m[0xd555].free_func,0,0x404);
    return;
  }
  return;
}

Assistant:

static void FN(Init)(
    MemoryManager* m, HashForgetfulChain* self, const uint8_t* data,
    const BrotliEncoderParams* params, size_t position, size_t bytes,
    BROTLI_BOOL is_last) {
  /* Choose which initialization method is faster.
     Init() is about 100 times faster than InitForData(). */
  const size_t kMaxBytesForPartialHashInit = BUCKET_SIZE >> 6;
  BROTLI_UNUSED(m);
  self->max_hops = (params->quality > 6 ? 7u : 8u) << (params->quality - 4);
  if (position == 0 && is_last && bytes <= kMaxBytesForPartialHashInit) {
    FN(InitForData)(self, data, bytes);
  } else {
    FN(InitEmpty)(self);
  }
}